

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O2

void __thiscall ValidateVulnerability::CheckAllIntensityBinsPresent(ValidateVulnerability *this)

{
  _Base_ptr p_Var1;
  size_t sVar2;
  _Base_ptr p_Var3;
  char *__ptr;
  int iVar4;
  size_t sStack_80;
  char bins [5];
  set<int,_std::less<int>,_std::allocator<int>_> missingIntensityBins;
  
  p_Var1 = (this->vulIDToIntBinIDs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var1 == &(this->vulIDToIntBinIDs_)._M_t._M_impl.super__Rb_tree_header)
    {
      return;
    }
    if (p_Var1[2]._M_left !=
        (_Base_ptr)(this->intensityBinIDs_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      (this->super_Validate).warnings_ = true;
      missingIntensityBins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      missingIntensityBins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      missingIntensityBins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &missingIntensityBins._M_t._M_impl.super__Rb_tree_header._M_header;
      missingIntensityBins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      missingIntensityBins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           missingIntensityBins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::
      __set_difference<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((this->intensityBinIDs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 &(this->intensityBinIDs_)._M_t._M_impl.super__Rb_tree_header,
                 *(undefined8 *)(p_Var1 + 2),&p_Var1[1]._M_left,&missingIntensityBins);
      bins[4] = '\0';
      builtin_strncpy(bins,"bin",4);
      if (1 < missingIntensityBins._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        sVar2 = strlen(bins);
        (bins + sVar2)[0] = 's';
        (bins + sVar2)[1] = '\0';
      }
      fprintf(_stderr,"WARNING: Vulnerability ID %d: Intensity %s ",(ulong)p_Var1[1]._M_color,bins);
      iVar4 = (int)missingIntensityBins._M_t._M_impl.super__Rb_tree_header._M_node_count;
      for (p_Var3 = missingIntensityBins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &missingIntensityBins._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        fprintf(_stderr,"%d",(ulong)p_Var3[1]._M_color);
        if (iVar4 < 3) {
          if (iVar4 == 2) {
            __ptr = " and ";
            sStack_80 = 5;
            goto LAB_00102bec;
          }
        }
        else {
          __ptr = ", ";
          sStack_80 = 2;
LAB_00102bec:
          fwrite(__ptr,sStack_80,1,_stderr);
        }
        iVar4 = iVar4 + -1;
      }
      fwrite(" missing. All intensity bins must be present for each vulnerability ID in single peril models.\n"
             ,0x5f,1,_stderr);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&missingIntensityBins._M_t);
    }
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
  } while( true );
}

Assistant:

void ValidateVulnerability::CheckAllIntensityBinsPresent() {
/* Each vulnerability ID should have entries for all intensity bins in single
 * peril models. As it is not possible to establish from the vulnerability file
 * alone whether it belongs to a single peril model, this is issued as a
 * warning. This check can be supressed with a command line argument. */

  for (auto iter = vulIDToIntBinIDs_.begin(); iter != vulIDToIntBinIDs_.end();
       ++iter) {

    if (iter->second.size() != intensityBinIDs_.size()) {

      warnings_ = true;

      std::set<int> missingIntensityBins;
      std::set_difference(intensityBinIDs_.begin(), intensityBinIDs_.end(),
			  iter->second.begin(), iter->second.end(),
			  std::inserter(missingIntensityBins,
					missingIntensityBins.end()));

      char bins[5] = "bin";
      if (missingIntensityBins.size() > 1) strcat(bins, "s");
      fprintf(stderr, "WARNING: Vulnerability ID %d: Intensity %s ",
	      iter->first, bins);
      int numberOfMissingBinsLeft = missingIntensityBins.size();

      for (auto missBinsIter = missingIntensityBins.begin();
	   missBinsIter != missingIntensityBins.end(); ++missBinsIter) {
        fprintf(stderr, "%d", *missBinsIter);
	if (numberOfMissingBinsLeft > 2) {
          fprintf(stderr, ", ");
	} else if (numberOfMissingBinsLeft == 2) {
          fprintf(stderr, " and ");
	}
	--numberOfMissingBinsLeft;
      }
      fprintf(stderr, " missing. All intensity bins must be present for each"
		      " vulnerability ID in single peril models.\n");

    }

  }

}